

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

CURLcode Curl_is_connected(connectdata *conn,int sockindex,_Bool *connected)

{
  long lVar1;
  undefined8 uVar2;
  Curl_addrinfo *pCVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  bool bVar8;
  int iVar9;
  bool bVar10;
  _Bool _Var11;
  CURLcode CVar12;
  uint uVar13;
  CURLcode CVar14;
  timediff_t tVar15;
  int *piVar16;
  char *pcVar17;
  uint uVar18;
  long lVar19;
  Curl_easy *pCVar20;
  curltime cVar21;
  curltime newer;
  curltime older;
  curltime older_00;
  int error;
  char ipaddress [46];
  char buffer [256];
  int local_1a8;
  int local_1a4;
  CURLcode local_1a0;
  uint local_19c;
  curltime local_198;
  long local_188;
  _Bool *local_180;
  Curl_easy *local_178;
  ulong local_170;
  char local_168 [48];
  char local_138 [264];
  
  pCVar20 = conn->data;
  local_1a8 = 0;
  *connected = false;
  if ((conn->bits).tcpconnect[sockindex] == true) {
    *connected = true;
    CVar12 = CURLE_OK;
  }
  else {
    cVar21 = Curl_now();
    local_198.tv_sec = cVar21.tv_sec;
    local_198.tv_usec = cVar21.tv_usec;
    local_170 = Curl_timeleft(pCVar20,&local_198,true);
    if ((long)local_170 < 0) {
      Curl_failf(pCVar20,"Connection time-out");
      CVar12 = CURLE_OPERATION_TIMEDOUT;
    }
    else if ((conn->cnnct).state - CONNECT_SOCKS_INIT < 0x10) {
      CVar12 = connect_SOCKS(conn,sockindex,connected);
      if ((CVar12 == CURLE_OK) && (CVar12 = CURLE_OK, *connected == true)) {
LAB_001275f1:
        post_SOCKS(conn,sockindex,connected);
        CVar12 = CURLE_OK;
      }
    }
    else {
      lVar19 = 0;
      local_1a0 = CURLE_OK;
      local_1a4 = sockindex;
      local_188 = (long)sockindex;
      local_180 = connected;
      local_178 = pCVar20;
      bVar10 = true;
      do {
        bVar8 = bVar10;
        if (conn->tempsock[lVar19] != -1) {
          uVar18 = (uint)lVar19 ^ 1;
          uVar13 = Curl_socket_check(-1,-1,conn->tempsock[lVar19],0);
          if (uVar13 == 2) {
LAB_00127434:
            _Var11 = verifyconnect(conn->tempsock[lVar19],&local_1a8);
            if (_Var11) {
              conn->sock[local_188] = conn->tempsock[lVar19];
              pCVar3 = conn->tempaddr[lVar19];
              conn->ip_addr = pCVar3;
              conn->tempsock[lVar19] = -1;
              *(uint *)&(conn->bits).field_0x4 =
                   *(uint *)&(conn->bits).field_0x4 & 0xfffff7ff |
                   (uint)(pCVar3->ai_family == 10) << 0xb;
              if (conn->tempsock[uVar18] != -1) {
                Curl_closesocket(conn,conn->tempsock[uVar18]);
                conn->tempsock[uVar18] = -1;
              }
              connected = local_180;
              sockindex = local_1a4;
              CVar12 = connect_SOCKS(conn,local_1a4,local_180);
              if (CVar12 != CURLE_OK) {
                return CVar12;
              }
              if (*connected != true) {
                return CURLE_OK;
              }
              goto LAB_001275f1;
            }
            Curl_infof(pCVar20,"Connection failed\n");
          }
          else if (uVar13 == 0) {
            local_1a8 = 0;
            cVar21.tv_usec = local_198.tv_usec;
            cVar21.tv_sec = local_198.tv_sec;
            uVar4 = (conn->connecttime).tv_sec;
            uVar5 = (conn->connecttime).tv_usec;
            older.tv_usec = uVar5;
            older.tv_sec = uVar4;
            cVar21._12_4_ = 0;
            older._12_4_ = 0;
            tVar15 = Curl_timediff(cVar21,older);
            if (conn->timeoutms_per_addr <= tVar15) {
              Curl_infof(pCVar20,"After %ldms connect time, move on!\n");
              local_1a8 = 0x6e;
            }
            if (((bVar8) && (conn->tempaddr[1] == (Curl_addrinfo *)0x0)) &&
               (newer.tv_usec = local_198.tv_usec, newer.tv_sec = local_198.tv_sec,
               uVar6 = (conn->connecttime).tv_sec, uVar7 = (conn->connecttime).tv_usec,
               older_00.tv_usec = uVar7, older_00.tv_sec = uVar6, newer._12_4_ = 0,
               older_00._12_4_ = 0, tVar15 = Curl_timediff(newer,older_00),
               (pCVar20->set).happy_eyeballs_timeout <= tVar15)) {
              trynextip(conn,local_1a4,1);
            }
          }
          else {
            if (((conn->bits).field_0x7 & 8) != 0) goto LAB_00127434;
            if ((uVar13 & 4) != 0) {
              verifyconnect(conn->tempsock[lVar19],&local_1a8);
            }
          }
          iVar9 = local_1a8;
          if (local_1a8 != 0) {
            (pCVar20->state).os_errno = local_1a8;
            piVar16 = __errno_location();
            *piVar16 = iVar9;
            if (conn->tempaddr[lVar19] != (Curl_addrinfo *)0x0) {
              local_19c = uVar18;
              Curl_printable_address(conn->tempaddr[lVar19],local_168,0x2e);
              lVar1 = conn->port;
              pcVar17 = Curl_strerror(local_1a8,local_138,0x100);
              Curl_infof(pCVar20,"connect to %s port %ld failed: %s\n",local_168,lVar1,pcVar17);
              conn->timeoutms_per_addr =
                   local_170 >> (conn->tempaddr[lVar19]->ai_next != (Curl_addrinfo *)0x0);
              CVar12 = trynextip(conn,local_1a4,(uint)lVar19);
              pCVar20 = local_178;
              if ((CVar12 != CURLE_COULDNT_CONNECT) || (conn->tempsock[local_19c] == -1)) {
                local_1a0 = CVar12;
              }
            }
          }
        }
        lVar19 = 1;
        bVar10 = false;
      } while (bVar8);
      CVar12 = CURLE_OK;
      if ((local_1a0 != CURLE_OK) &&
         ((CVar14 = local_1a0, conn->tempaddr[1] != (Curl_addrinfo *)0x0 ||
          (CVar14 = trynextip(conn,local_1a4,1), CVar14 != CURLE_OK)))) {
        uVar13 = *(uint *)&(conn->bits).field_0x4;
        lVar19 = 0x390;
        if ((-1 < (char)uVar13) &&
           ((lVar19 = 0x3d0, (uVar13 & 0x40) == 0 && (lVar19 = 0x370, (uVar13 & 8) == 0)))) {
          lVar19 = 0x340;
        }
        uVar2 = *(undefined8 *)((conn->cnnct).socksreq + lVar19 + -0xc);
        lVar19 = conn->port;
        pcVar17 = Curl_strerror(local_1a8,local_138,0x100);
        Curl_failf(pCVar20,"Failed to connect to %s port %ld: %s",uVar2,lVar19,pcVar17);
        CVar12 = CVar14;
        if ((pCVar20->state).os_errno == 0x6e) {
          CVar12 = CURLE_OPERATION_TIMEDOUT;
        }
      }
    }
  }
  return CVar12;
}

Assistant:

CURLcode Curl_is_connected(struct connectdata *conn,
                           int sockindex,
                           bool *connected)
{
  struct Curl_easy *data = conn->data;
  CURLcode result = CURLE_OK;
  timediff_t allow;
  int error = 0;
  struct curltime now;
  int rc;
  int i;

  DEBUGASSERT(sockindex >= FIRSTSOCKET && sockindex <= SECONDARYSOCKET);

  *connected = FALSE; /* a very negative world view is best */

  if(conn->bits.tcpconnect[sockindex]) {
    /* we are connected already! */
    *connected = TRUE;
    return CURLE_OK;
  }

  now = Curl_now();

  /* figure out how long time we have left to connect */
  allow = Curl_timeleft(data, &now, TRUE);

  if(allow < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  if(SOCKS_STATE(conn->cnnct.state)) {
    /* still doing SOCKS */
    result = connect_SOCKS(conn, sockindex, connected);
    if(!result && *connected)
      post_SOCKS(conn, sockindex, connected);
    return result;
  }

  for(i = 0; i<2; i++) {
    const int other = i ^ 1;
    if(conn->tempsock[i] == CURL_SOCKET_BAD)
      continue;

#ifdef ENABLE_QUIC
    if(conn->transport == TRNSPRT_QUIC) {
      result = Curl_quic_is_connected(conn, i, connected);
      if(result) {
        error = SOCKERRNO;
        goto error;
      }
      if(*connected) {
        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;
        connkeep(conn, "HTTP/3 default");
      }
      return result;
    }
#endif

#ifdef mpeix
    /* Call this function once now, and ignore the results. We do this to
       "clear" the error state on the socket so that we can later read it
       reliably. This is reported necessary on the MPE/iX operating system. */
    (void)verifyconnect(conn->tempsock[i], NULL);
#endif

    /* check socket for connect */
    rc = SOCKET_WRITABLE(conn->tempsock[i], 0);

    if(rc == 0) { /* no connection yet */
      error = 0;
      if(Curl_timediff(now, conn->connecttime) >= conn->timeoutms_per_addr) {
        infof(data, "After %" CURL_FORMAT_TIMEDIFF_T
              "ms connect time, move on!\n", conn->timeoutms_per_addr);
        error = ETIMEDOUT;
      }

      /* should we try another protocol family? */
      if(i == 0 && conn->tempaddr[1] == NULL &&
         (Curl_timediff(now, conn->connecttime) >=
          data->set.happy_eyeballs_timeout)) {
        trynextip(conn, sockindex, 1);
      }
    }
    else if(rc == CURL_CSELECT_OUT || conn->bits.tcp_fastopen) {
      if(verifyconnect(conn->tempsock[i], &error)) {
        /* we are connected with TCP, awesome! */

        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;
#ifdef ENABLE_IPV6
        conn->bits.ipv6 = (conn->ip_addr->ai_family == AF_INET6)?TRUE:FALSE;
#endif

        /* close the other socket, if open */
        if(conn->tempsock[other] != CURL_SOCKET_BAD) {
          Curl_closesocket(conn, conn->tempsock[other]);
          conn->tempsock[other] = CURL_SOCKET_BAD;
        }

        /* see if we need to kick off any SOCKS proxy magic once we
           connected */
        result = connect_SOCKS(conn, sockindex, connected);
        if(result || !*connected)
          return result;

        post_SOCKS(conn, sockindex, connected);

        return CURLE_OK;
      }
      infof(data, "Connection failed\n");
    }
    else if(rc & CURL_CSELECT_ERR)
      (void)verifyconnect(conn->tempsock[i], &error);

#ifdef ENABLE_QUIC
    error:
#endif
    /*
     * The connection failed here, we should attempt to connect to the "next
     * address" for the given host. But first remember the latest error.
     */
    if(error) {
      data->state.os_errno = error;
      SET_SOCKERRNO(error);
      if(conn->tempaddr[i]) {
        CURLcode status;
#ifndef CURL_DISABLE_VERBOSE_STRINGS
        char ipaddress[MAX_IPADR_LEN];
        char buffer[STRERROR_LEN];
        Curl_printable_address(conn->tempaddr[i], ipaddress, MAX_IPADR_LEN);
#endif
        infof(data, "connect to %s port %ld failed: %s\n",
              ipaddress, conn->port,
              Curl_strerror(error, buffer, sizeof(buffer)));

        conn->timeoutms_per_addr = conn->tempaddr[i]->ai_next == NULL ?
          allow : allow / 2;

        status = trynextip(conn, sockindex, i);
        if((status != CURLE_COULDNT_CONNECT) ||
           conn->tempsock[other] == CURL_SOCKET_BAD)
          /* the last attempt failed and no other sockets remain open */
          result = status;
      }
    }
  }

  if(result) {
    /* no more addresses to try */
    const char *hostname;
    char buffer[STRERROR_LEN];

    /* if the first address family runs out of addresses to try before
       the happy eyeball timeout, go ahead and try the next family now */
    if(conn->tempaddr[1] == NULL) {
      result = trynextip(conn, sockindex, 1);
      if(!result)
        return result;
    }

    if(conn->bits.socksproxy)
      hostname = conn->socks_proxy.host.name;
    else if(conn->bits.httpproxy)
      hostname = conn->http_proxy.host.name;
    else if(conn->bits.conn_to_host)
      hostname = conn->conn_to_host.name;
    else
      hostname = conn->host.name;

    failf(data, "Failed to connect to %s port %ld: %s",
          hostname, conn->port,
          Curl_strerror(error, buffer, sizeof(buffer)));

#ifdef WSAETIMEDOUT
    if(WSAETIMEDOUT == data->state.os_errno)
      result = CURLE_OPERATION_TIMEDOUT;
#elif defined(ETIMEDOUT)
    if(ETIMEDOUT == data->state.os_errno)
      result = CURLE_OPERATION_TIMEDOUT;
#endif
  }

  return result;
}